

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Qbf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGia;
  bool bVar1;
  int iVar2;
  uint nPars;
  uint uVar3;
  uint fVerbose;
  uint fGlucose;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  
  local_58 = 0;
  Extra_UtilGetoptReset();
  nPars = 0xffffffff;
  local_5c = 0;
  local_54 = 0;
  local_50 = 0;
  bVar1 = false;
  fGlucose = 0;
  fVerbose = 0;
LAB_0028d83e:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"PICTKdgvh");
    iVar6 = globalUtilOptind;
    if (iVar2 < 0x54) {
      if (iVar2 < 0x4b) {
        if (iVar2 == 0x43) {
          if (argc <= globalUtilOptind) {
            pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
            goto LAB_0028d9e9;
          }
          local_5c = atoi(argv[globalUtilOptind]);
          uVar3 = local_5c;
        }
        else {
          if (iVar2 != 0x49) {
            if (iVar2 == -1) {
              pGia = pAbc->pGia;
              if (pGia == (Gia_Man_t *)0x0) {
                pcVar4 = "There is no current GIA.\n";
              }
              else if (pGia->nRegs == 0) {
                if (pGia->vCos->nSize == 1) {
                  if ((0 < (int)nPars) && ((int)nPars < pGia->vCis->nSize)) {
                    if (bVar1) {
                      Gia_QbfDumpFile(pGia,nPars);
                    }
                    else {
                      Gia_QbfSolve(pGia,nPars,local_58,local_5c,local_54,local_50,fGlucose,fVerbose)
                      ;
                    }
                    return 0;
                  }
                  pcVar4 = 
                  "The number of parameter variables is invalid (should be > 0 and < PI num).\n";
                }
                else {
                  pcVar4 = "The miter should have one primary output.\n";
                }
              }
              else {
                pcVar4 = "Works only for combinational networks.\n";
              }
              iVar6 = -1;
              goto LAB_0028db04;
            }
            goto LAB_0028d9f5;
          }
          if (argc <= globalUtilOptind) {
            pcVar4 = "Command line switch \"-I\" should be followed by an integer.\n";
            goto LAB_0028d9e9;
          }
          local_58 = atoi(argv[globalUtilOptind]);
          uVar3 = local_58;
        }
      }
      else if (iVar2 == 0x4b) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-K\" should be followed by an integer.\n";
          goto LAB_0028d9e9;
        }
        local_50 = atoi(argv[globalUtilOptind]);
        uVar3 = local_50;
      }
      else {
        if (iVar2 != 0x50) goto LAB_0028d9f5;
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-P\" should be followed by an integer.\n";
LAB_0028d9e9:
          Abc_Print(-1,pcVar4);
          goto LAB_0028d9f5;
        }
        nPars = atoi(argv[globalUtilOptind]);
        uVar3 = nPars;
      }
    }
    else {
      if (0x66 < iVar2) {
        if (iVar2 == 0x67) {
          fGlucose = fGlucose ^ 1;
        }
        else {
          if (iVar2 != 0x76) goto LAB_0028d9f5;
          fVerbose = fVerbose ^ 1;
        }
        goto LAB_0028d83e;
      }
      if (iVar2 != 0x54) {
        if (iVar2 != 100) goto LAB_0028d9f5;
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_0028d83e;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0028d9e9;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar3 = local_54;
    }
    globalUtilOptind = iVar6 + 1;
    if ((int)uVar3 < 0) {
LAB_0028d9f5:
      Abc_Print(-2,"usage: &qbf [-PICTK num] [-dgvh]\n");
      Abc_Print(-2,"\t         solves QBF problem EpVxM(p,x)\n");
      Abc_Print(-2,"\t-P num : number of parameters p (should be the first PIs) [default = %d]\n",
                (ulong)nPars);
      Abc_Print(-2,"\t-I num : quit after the given iteration even if unsolved [default = %d]\n",
                (ulong)local_58);
      Abc_Print(-2,"\t-C num : conflict limit per problem [default = %d]\n",(ulong)local_5c);
      Abc_Print(-2,"\t-T num : global timeout [default = %d]\n",(ulong)local_54);
      Abc_Print(-2,"\t-K num : the number of input bits (for encoding miters only) [default = %d]\n"
                ,(ulong)local_50);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (!bVar1) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle dumping QDIMACS file instead of solving [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (fGlucose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-g     : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
                ,pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar6 = -2;
LAB_0028db04:
      Abc_Print(iVar6,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Qbf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_QbfDumpFile( Gia_Man_t * pGia, int nPars );
    extern int Gia_QbfSolve( Gia_Man_t * pGia, int nPars, int nIterLimit, int nConfLimit, int nTimeOut, int nEncVars, int fGlucose, int fVerbose );
    int c, nPars   = -1;
    int nIterLimit =  0;
    int nConfLimit =  0;
    int nTimeOut   =  0;
    int nEncVars   =  0;
    int fDumpCnf   =  0;
    int fGlucose   =  0;
    int fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PICTKdgvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPars < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIterLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIterLimit < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nEncVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nEncVars < 0 )
                goto usage;
            break;
        case 'd':
            fDumpCnf ^= 1;
            break;
        case 'g':
            fGlucose ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no current GIA.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Works only for combinational networks.\n" );
        return 1;
    }
    if ( Gia_ManPoNum(pAbc->pGia) != 1 )
    {
        Abc_Print( -1, "The miter should have one primary output.\n" );
        return 1;
    }
    if ( !(nPars > 0 && nPars < Gia_ManPiNum(pAbc->pGia)) )
    {
        Abc_Print( -1, "The number of parameter variables is invalid (should be > 0 and < PI num).\n" );
        return 1;
    }
    if ( fDumpCnf )
        Gia_QbfDumpFile( pAbc->pGia, nPars );
    else
        Gia_QbfSolve( pAbc->pGia, nPars, nIterLimit, nConfLimit, nTimeOut, nEncVars, fGlucose, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &qbf [-PICTK num] [-dgvh]\n" );
    Abc_Print( -2, "\t         solves QBF problem EpVxM(p,x)\n" );
    Abc_Print( -2, "\t-P num : number of parameters p (should be the first PIs) [default = %d]\n", nPars );
    Abc_Print( -2, "\t-I num : quit after the given iteration even if unsolved [default = %d]\n", nIterLimit );
    Abc_Print( -2, "\t-C num : conflict limit per problem [default = %d]\n", nConfLimit );
    Abc_Print( -2, "\t-T num : global timeout [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-K num : the number of input bits (for encoding miters only) [default = %d]\n", nEncVars );
    Abc_Print( -2, "\t-d     : toggle dumping QDIMACS file instead of solving [default = %s]\n", fDumpCnf? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", fGlucose? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}